

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RevoluteJoint.cpp
# Opt level: O0

void __thiscall
iDynTree::RevoluteJoint::setAxis
          (RevoluteJoint *this,Axis *revoluteAxis,LinkIndex child,LinkIndex param_4)

{
  long in_RDX;
  long in_RDI;
  RevoluteJoint *in_stack_000000a0;
  Axis local_80;
  Axis local_50;
  
  if (in_RDX == *(long *)(in_RDI + 0x20)) {
    iDynTree::Axis::reverse();
    iDynTree::Axis::operator=((Axis *)(in_RDI + 0x90),&local_50);
  }
  else {
    iDynTree::Transform::operator*((Transform *)&local_80,(Axis *)(in_RDI + 0x30));
    iDynTree::Axis::operator=((Axis *)(in_RDI + 0x90),&local_80);
  }
  resetAxisBuffers(in_stack_000000a0);
  return;
}

Assistant:

void RevoluteJoint::setAxis(const Axis &revoluteAxis,
                            const LinkIndex child, const LinkIndex /*parent*/)
{
    if( child == link1 )
    {
        rotation_axis_wrt_link1 = revoluteAxis.reverse();
    }
    else
    {
        assert(child == link2);
        rotation_axis_wrt_link1 = link1_X_link2_at_rest*revoluteAxis;
    }

    this->resetAxisBuffers();
}